

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CSubNet::Match(CSubNet *this,CNetAddr *addr)

{
  Network NVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  CSubNet *pCVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->valid == true) && (bVar6 = CNetAddr::IsValid(addr), bVar6)) &&
     (NVar1 = (this->network).m_net, NVar1 == addr->m_net)) {
    if (NVar1 - NET_ONION < 4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        bVar6 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator==
                          (&addr->m_addr,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)this);
        return bVar6;
      }
      goto LAB_00d51061;
    }
    bVar6 = false;
    if ((NVar1 != NET_UNROUTABLE) && (NVar1 != NET_MAX)) {
      uVar2 = (this->network).m_addr._size;
      uVar5 = uVar2 - 0x11;
      if (uVar2 < 0x11) {
        uVar5 = uVar2;
      }
      uVar3 = (addr->m_addr)._size;
      uVar8 = uVar3 - 0x11;
      if (uVar3 < 0x11) {
        uVar8 = uVar3;
      }
      if (uVar5 != uVar8) {
        __assert_fail("network.m_addr.size() == addr.m_addr.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                      ,0x410,"bool CSubNet::Match(const CNetAddr &) const");
      }
      if (uVar5 == 0) {
        bVar6 = true;
      }
      else {
        if (0x10 < uVar3) {
          addr = (CNetAddr *)(addr->m_addr)._union.indirect_contents.indirect;
        }
        pCVar7 = this;
        if (0x10 < uVar2) {
          pCVar7 = (CSubNet *)(this->network).m_addr._union.indirect_contents.indirect;
        }
        lVar9 = 0;
        lVar10 = 0;
        do {
          bVar6 = (this->netmask[lVar10] & (addr->m_addr)._union.direct[lVar9 >> 0x20]) ==
                  pCVar7->netmask[(lVar9 >> 0x20) + -0x20];
          if (!bVar6) break;
          lVar9 = lVar9 + 0x100000000;
          bVar11 = (ulong)uVar5 - 1 != lVar10;
          lVar10 = lVar10 + 1;
        } while (bVar11);
      }
    }
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return bVar6;
  }
LAB_00d51061:
  __stack_chk_fail();
}

Assistant:

bool CSubNet::Match(const CNetAddr &addr) const
{
    if (!valid || !addr.IsValid() || network.m_net != addr.m_net)
        return false;

    switch (network.m_net) {
    case NET_IPV4:
    case NET_IPV6:
        break;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
    case NET_INTERNAL:
        return addr == network;
    case NET_UNROUTABLE:
    case NET_MAX:
        return false;
    }

    assert(network.m_addr.size() == addr.m_addr.size());
    for (size_t x = 0; x < addr.m_addr.size(); ++x) {
        if ((addr.m_addr[x] & netmask[x]) != network.m_addr[x]) {
            return false;
        }
    }
    return true;
}